

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regalloc.cpp
# Opt level: O2

RACell * __thiscall asmjit::RAPass::_newVarCell(RAPass *this,VirtReg *vreg)

{
  uint32_t size;
  Zone *this_00;
  uint uVar1;
  RACell *pRVar2;
  
  if (vreg->_memCell != (RACell *)0x0) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/base/regalloc.cpp"
               ,0xa5,"vreg->_memCell == nullptr");
  }
  size = vreg->_size;
  if ((vreg->field_0x17 & 2) == 0) {
    this_00 = this->_zone;
    pRVar2 = (RACell *)this_00->_ptr;
    if ((ulong)((long)this_00->_end - (long)pRVar2) < 0x18) {
      pRVar2 = (RACell *)Zone::_alloc(this_00,0x18);
    }
    else {
      this_00->_ptr = (uint8_t *)(pRVar2 + 1);
      if ((RACell *)this_00->_end < pRVar2 + 1) {
        DebugUtils::assertionFailed
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/base/../base/../base/../base/../base/../base/../base/zone.h"
                   ,0x9b,"_ptr <= _end");
      }
    }
    if (pRVar2 == (RACell *)0x0) {
      CodeEmitter::setLastError(&((this->super_CBPass)._cb)->super_CodeEmitter,1,(char *)0x0);
      return (RACell *)0x0;
    }
    pRVar2->next = this->_memVarCells;
    pRVar2->offset = 0;
    pRVar2->size = size;
    pRVar2->alignment = size;
    this->_memVarCells = pRVar2;
    uVar1 = this->_memMaxAlign;
    if (this->_memMaxAlign <= size) {
      uVar1 = size;
    }
    this->_memMaxAlign = uVar1;
    this->_memVarTotal = this->_memVarTotal + size;
    switch(size) {
    case 1:
      this->_mem1ByteVarsUsed = this->_mem1ByteVarsUsed + 1;
      break;
    case 2:
      this->_mem2ByteVarsUsed = this->_mem2ByteVarsUsed + 1;
      break;
    case 3:
    case 5:
    case 6:
    case 7:
switchD_0016f6d9_caseD_3:
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/base/regalloc.cpp"
                 ,0xc5,"ASMJIT_NOT_REACHED has been reached");
    case 4:
      this->_mem4ByteVarsUsed = this->_mem4ByteVarsUsed + 1;
      break;
    case 8:
      this->_mem8ByteVarsUsed = this->_mem8ByteVarsUsed + 1;
      break;
    default:
      if (size == 0x10) {
        this->_mem16ByteVarsUsed = this->_mem16ByteVarsUsed + 1;
      }
      else if (size == 0x20) {
        this->_mem32ByteVarsUsed = this->_mem32ByteVarsUsed + 1;
      }
      else {
        if (size != 0x40) goto switchD_0016f6d9_caseD_3;
        this->_mem64ByteVarsUsed = this->_mem64ByteVarsUsed + 1;
      }
    }
  }
  else {
    pRVar2 = _newStackCell(this,size,(uint)vreg->_alignment);
    if (pRVar2 == (RACell *)0x0) {
      return (RACell *)0x0;
    }
  }
  vreg->_memCell = pRVar2;
  return pRVar2;
}

Assistant:

RACell* RAPass::_newVarCell(VirtReg* vreg) {
  ASMJIT_ASSERT(vreg->_memCell == nullptr);

  RACell* cell;
  uint32_t size = vreg->getSize();

  if (vreg->isStack()) {
    cell = _newStackCell(size, vreg->getAlignment());
    if (ASMJIT_UNLIKELY(!cell)) return nullptr;
  }
  else {
    cell = static_cast<RACell*>(_zone->alloc(sizeof(RACell)));
    if (!cell) goto _NoMemory;

    cell->next = _memVarCells;
    cell->offset = 0;
    cell->size = size;
    cell->alignment = size;

    _memVarCells = cell;
    _memMaxAlign = std::max<uint32_t>(_memMaxAlign, size);
    _memVarTotal += size;

    switch (size) {
      case  1: _mem1ByteVarsUsed++ ; break;
      case  2: _mem2ByteVarsUsed++ ; break;
      case  4: _mem4ByteVarsUsed++ ; break;
      case  8: _mem8ByteVarsUsed++ ; break;
      case 16: _mem16ByteVarsUsed++; break;
      case 32: _mem32ByteVarsUsed++; break;
      case 64: _mem64ByteVarsUsed++; break;

      default:
        ASMJIT_NOT_REACHED();
    }
  }

  vreg->_memCell = cell;
  return cell;

_NoMemory:
  cc()->setLastError(DebugUtils::errored(kErrorNoHeapMemory));
  return nullptr;
}